

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_grzip.c
# Opt level: O0

int archive_write_add_filter_grzip(archive *_a)

{
  int iVar1;
  archive_write_filter *paVar2;
  long *__ptr;
  archive_write_program_data *paVar3;
  archive *in_RDI;
  int magic_test;
  write_grzip *data;
  archive_write_filter *f;
  char *in_stack_00000078;
  uint in_stack_00000080;
  uint in_stack_00000084;
  archive *in_stack_00000088;
  archive *in_stack_ffffffffffffffe0;
  int local_4;
  
  paVar2 = __archive_write_allocate_filter(in_stack_ffffffffffffffe0);
  iVar1 = __archive_check_magic
                    (in_stack_00000088,in_stack_00000084,in_stack_00000080,in_stack_00000078);
  if (iVar1 == -0x1e) {
    local_4 = -0x1e;
  }
  else {
    __ptr = (long *)calloc(1,8);
    if (__ptr == (long *)0x0) {
      archive_set_error(in_RDI,0xc,"Can\'t allocate memory");
      local_4 = -0x1e;
    }
    else {
      paVar3 = __archive_write_program_allocate();
      *__ptr = (long)paVar3;
      if (*__ptr == 0) {
        free(__ptr);
        archive_set_error(in_RDI,0xc,"Can\'t allocate memory");
        local_4 = -0x1e;
      }
      else {
        paVar2->name = "grzip";
        paVar2->code = 0xc;
        paVar2->data = __ptr;
        paVar2->open = archive_write_grzip_open;
        paVar2->options = archive_write_grzip_options;
        paVar2->write = archive_write_grzip_write;
        paVar2->close = archive_write_grzip_close;
        paVar2->free = archive_write_grzip_free;
        archive_set_error(in_RDI,-1,"Using external grzip program for grzip compression");
        local_4 = -0x14;
      }
    }
  }
  return local_4;
}

Assistant:

int
archive_write_add_filter_grzip(struct archive *_a)
{
	struct archive_write_filter *f = __archive_write_allocate_filter(_a);
	struct write_grzip *data;

	archive_check_magic(_a, ARCHIVE_WRITE_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_write_add_filter_grzip");

	data = calloc(1, sizeof(*data));
	if (data == NULL) {
		archive_set_error(_a, ENOMEM, "Can't allocate memory");
		return (ARCHIVE_FATAL);
	}
	data->pdata = __archive_write_program_allocate();
	if (data->pdata == NULL) {
		free(data);
		archive_set_error(_a, ENOMEM, "Can't allocate memory");
		return (ARCHIVE_FATAL);
	}

	f->name = "grzip";
	f->code = ARCHIVE_FILTER_GRZIP;
	f->data = data;
	f->open = archive_write_grzip_open;
	f->options = archive_write_grzip_options;
	f->write = archive_write_grzip_write;
	f->close = archive_write_grzip_close;
	f->free = archive_write_grzip_free;

	/* Note: This filter always uses an external program, so we
	 * return "warn" to inform of the fact. */
	archive_set_error(_a, ARCHIVE_ERRNO_MISC,
	    "Using external grzip program for grzip compression");
	return (ARCHIVE_WARN);
}